

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBodyConstraintSolver.cpp
# Opt level: O1

void __thiscall
btMultiBodyConstraintSolver::solveMultiBodyGroup
          (btMultiBodyConstraintSolver *this,btCollisionObject **bodies,int numBodies,
          btPersistentManifold **manifold,int numManifolds,btTypedConstraint **constraints,
          int numConstraints,btMultiBodyConstraint **multiBodyConstraints,
          int numMultiBodyConstraints,btContactSolverInfo *info,btIDebugDraw *debugDrawer,
          btDispatcher *dispatcher)

{
  this->m_tmpMultiBodyConstraints = multiBodyConstraints;
  this->m_tmpNumMultiBodyConstraints = numMultiBodyConstraints;
  btSequentialImpulseConstraintSolver::solveGroup
            (&this->super_btSequentialImpulseConstraintSolver,bodies,numBodies,manifold,numManifolds
             ,constraints,numConstraints,info,debugDrawer,dispatcher);
  this->m_tmpMultiBodyConstraints = (btMultiBodyConstraint **)0x0;
  this->m_tmpNumMultiBodyConstraints = 0;
  return;
}

Assistant:

void  btMultiBodyConstraintSolver::solveMultiBodyGroup(btCollisionObject** bodies,int numBodies,btPersistentManifold** manifold,int numManifolds,btTypedConstraint** constraints,int numConstraints,btMultiBodyConstraint** multiBodyConstraints, int numMultiBodyConstraints, const btContactSolverInfo& info, btIDebugDraw* debugDrawer,btDispatcher* dispatcher)
{
	//printf("solveMultiBodyGroup start\n");
	m_tmpMultiBodyConstraints = multiBodyConstraints;
	m_tmpNumMultiBodyConstraints = numMultiBodyConstraints;
	
	btSequentialImpulseConstraintSolver::solveGroup(bodies,numBodies,manifold,numManifolds,constraints,numConstraints,info,debugDrawer,dispatcher);

	m_tmpMultiBodyConstraints = 0;
	m_tmpNumMultiBodyConstraints = 0;
	

}